

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
enum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::do_validate
          (enum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
           *this)

{
  json_pointer *in_RCX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDX;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RSI;
  evaluation_results *in_R8;
  error_reporter *in_R9;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000008;
  
  enum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  do_validate((enum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)(this + *(long *)(*(long *)this + -0x38)),in_RSI,in_RDX,in_RCX,in_R8,in_R9,
              in_stack_00000008);
  return;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter,
            Json& /*patch*/) const final
        {
            eval_context<Json> this_context(context, this->keyword_name());

            bool in_range = false;
            for (const auto& item : value_.array_range())
            {
                if (item == instance) 
                {
                    in_range = true;
                    break;
                }
            }

            if (!in_range)
            {
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    "'" + instance.template as<std::string>() + "' is not a valid enum value."));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            return walk_result::advance;
        }